

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall PrintVisitor::visit(PrintVisitor *this,FunctionResultCallNode *node)

{
  ExpressionNode *pEVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  long *plVar4;
  PrintVisitor visitor;
  string sStack_58;
  undefined **local_38;
  ostream *local_30;
  int local_28;
  
  poVar3 = this->stream_;
  indent_abi_cxx11_(&sStack_58,this);
  poVar3 = std::operator<<(poVar3,(string *)&sStack_58);
  std::operator<<(poVar3,"FunctionResultCallNode:\n");
  std::__cxx11::string::~string((string *)&sStack_58);
  poVar3 = this->stream_;
  local_28 = this->indentation_ + 1;
  local_38 = &PTR__Visitor_00148d30;
  local_30 = poVar3;
  indent_abi_cxx11_(&sStack_58,this);
  poVar3 = std::operator<<(poVar3,(string *)&sStack_58);
  std::operator<<(poVar3,"Function:\n");
  std::__cxx11::string::~string((string *)&sStack_58);
  pEVar1 = (node->call_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_38);
  poVar3 = this->stream_;
  indent_abi_cxx11_(&sStack_58,this);
  poVar3 = std::operator<<(poVar3,(string *)&sStack_58);
  std::operator<<(poVar3,"Arguments:\n");
  std::__cxx11::string::~string((string *)&sStack_58);
  iVar2 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  while (plVar4 = (long *)*plVar4, plVar4 != (long *)CONCAT44(extraout_var,iVar2)) {
    (**(code **)(*(long *)plVar4[2] + 0x10))((long *)plVar4[2],&local_38);
  }
  return;
}

Assistant:

void PrintVisitor::visit(const FunctionResultCallNode& node)
{
  stream_ << indent() << "FunctionResultCallNode:\n";

  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  stream_ << indent() << "Function:\n";
  node.getCall().accept(visitor);
  
  stream_ << indent() << "Arguments:\n";
  for(const auto& arg : node.getArguments())
  {
    arg->accept(visitor);
  }
}